

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O0

server_pipe __thiscall pstore::brokerface::fifo_path::open_server_pipe(fifo_path *this)

{
  value_type vVar1;
  int iVar2;
  czstring path_00;
  int *piVar3;
  _Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
  extraout_RDX;
  mutex_type *in_RSI;
  server_pipe sVar4;
  descriptor<pstore::details::posix_descriptor_traits> local_50;
  pipe_descriptor fdwrite;
  mode_t mode;
  descriptor<pstore::details::posix_descriptor_traits> local_30;
  pipe_descriptor fdread;
  lock_guard<std::mutex> lock;
  char *path;
  fifo_path *this_local;
  
  path_00 = (czstring)std::__cxx11::string::c_str();
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&fdread,in_RSI);
  anon_unknown.dwarf_dd61e::open_fifo((anon_unknown_dwarf_dd61e *)&local_30,path_00,0);
  vVar1 = details::descriptor<pstore::details::posix_descriptor_traits>::native_handle(&local_30);
  if (vVar1 < 0) {
    iVar2 = anon_unknown.dwarf_dd61e::make_fifo(path_00,0x11b6);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      anon_unknown.dwarf_dd61e::raise_cannot_create_fifo(path_00,*piVar3);
    }
    std::atomic<bool>::operator=((atomic<bool> *)(in_RSI + 1),true);
    anon_unknown.dwarf_dd61e::open_fifo((anon_unknown_dwarf_dd61e *)&fdwrite,path_00,0);
    details::descriptor<pstore::details::posix_descriptor_traits>::operator=(&local_30,&fdwrite);
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&fdwrite);
    vVar1 = details::descriptor<pstore::details::posix_descriptor_traits>::native_handle(&local_30);
    if (vVar1 < 0) {
      piVar3 = __errno_location();
      anon_unknown.dwarf_dd61e::raise_cannot_create_fifo(path_00,*piVar3);
    }
  }
  anon_unknown.dwarf_dd61e::open_fifo((anon_unknown_dwarf_dd61e *)&local_50,path_00,1);
  vVar1 = details::descriptor<pstore::details::posix_descriptor_traits>::native_handle(&local_50);
  if (-1 < vVar1) {
    server_pipe::server_pipe((server_pipe *)this,&local_30,&local_50);
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&local_50);
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&local_30);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&fdread);
    sVar4.fd_.
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
    .
    super__Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
    ._M_head_impl = extraout_RDX._M_head_impl;
    sVar4.fd_.
    super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
    .super__Tuple_impl<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>.
    super__Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
    ._M_head_impl =
         (_Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
          )(_Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
            )this;
    return (server_pipe)
           sVar4.fd_.
           super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
    ;
  }
  piVar3 = __errno_location();
  anon_unknown.dwarf_dd61e::raise_cannot_create_fifo(path_00,*piVar3);
}

Assistant:

auto fifo_path::open_server_pipe () -> server_pipe {
            auto * const path = path_.c_str ();
            std::lock_guard<decltype (open_server_pipe_mut_)> //! OCLINT
                const lock{open_server_pipe_mut_};

            // The server opens its well-known FIFO read-only (since it only reads from it) each
            // time the number of clients goes from 1 to 0, the server will read an end of file on
            // the FIFO. To prevent the server from having to handle this case, we use the trick of
            // just having the server open its well-known FIFO for read–write. Unfortunately,
            // POSIX.1 specifically states that opening a FIFO for read–write is undefined. Although
            // most UNIX systems allow this, we use two open() calls instead.

            pipe_descriptor fdread = open_fifo (path, O_RDONLY);
            if (fdread.native_handle () < 0) {
                // If the file open failed, we create the FIFO and try again.
                constexpr mode_t mode =
                    S_IFIFO | S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH;
                if (make_fifo (path, mode) != 0) {
                    raise_cannot_create_fifo (path, errno);
                }

                needs_delete_ = true;

                fdread = open_fifo (path, O_RDONLY);
                if (fdread.native_handle () < 0) {
                    // Open failed for a second time. Give up.
                    raise_cannot_create_fifo (path, errno);
                }
            }

            pipe_descriptor fdwrite = open_fifo (path, O_WRONLY);
            if (fdwrite.native_handle () < 0) {
                raise_cannot_create_fifo (path, errno);
            }

            return {std::move (fdread), std::move (fdwrite)};
        }